

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-intrusive-list.cc
# Opt level: O0

void __thiscall IntrusiveListTest_size_empty_Test::TestBody(IntrusiveListTest_size_empty_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  string local_128;
  AssertHelper local_108;
  Message local_100;
  bool local_f1;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar__1;
  Message local_d8;
  size_type local_d0;
  uint local_c4;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar_1;
  string local_a8;
  AssertHelper local_88;
  Message local_80;
  bool local_71;
  undefined1 local_70 [8];
  AssertionResult gtest_ar_;
  AssertHelper local_58;
  Message local_50;
  size_type local_48;
  undefined4 local_3c;
  undefined1 local_38 [8];
  AssertionResult gtest_ar;
  TestObjectList list;
  IntrusiveListTest_size_empty_Test *this_local;
  
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::intrusive_list
            ((intrusive_list<(anonymous_namespace)::TestObject> *)&gtest_ar.message_);
  local_3c = 0;
  local_48 = wabt::intrusive_list<(anonymous_namespace)::TestObject>::size
                       ((intrusive_list<(anonymous_namespace)::TestObject> *)&gtest_ar.message_);
  pcVar3 = (char *)0x0;
  testing::internal::EqHelper<true>::Compare<unsigned_int,unsigned_long>
            (local_38,"0U",(uint *)"list.size()",(unsigned_long *)&local_3c,&local_48);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    testing::Message::Message(&local_50);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_38);
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-intrusive-list.cc"
               ,0xe4,pcVar2);
    testing::internal::AssertHelper::operator=(&local_58,&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    testing::Message::~Message(&local_50);
  }
  gtest_ar_.message_.ptr_._5_3_ = 0;
  gtest_ar_.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  if (gtest_ar_.message_.ptr_._4_4_ == 0) {
    local_71 = wabt::intrusive_list<(anonymous_namespace)::TestObject>::empty
                         ((intrusive_list<(anonymous_namespace)::TestObject> *)&gtest_ar.message_);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_70,&local_71,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
    if (!bVar1) {
      testing::Message::Message(&local_80);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_a8,(internal *)local_70,(AssertionResult *)"list.empty()","false","true",
                 pcVar3);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_88,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-intrusive-list.cc"
                 ,0xe5,pcVar2);
      testing::internal::AssertHelper::operator=(&local_88,&local_80);
      testing::internal::AssertHelper::~AssertHelper(&local_88);
      std::__cxx11::string::~string((string *)&local_a8);
      testing::Message::~Message(&local_80);
    }
    gtest_ar_.message_.ptr_._5_3_ = 0;
    gtest_ar_.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
    if (gtest_ar_.message_.ptr_._4_4_ == 0) {
      gtest_ar_1.message_.ptr_._4_4_ = 1;
      wabt::intrusive_list<(anonymous_namespace)::TestObject>::emplace_back<int>
                ((intrusive_list<(anonymous_namespace)::TestObject> *)&gtest_ar.message_,
                 (int *)((long)&gtest_ar_1.message_.ptr_ + 4));
      local_c4 = 1;
      local_d0 = wabt::intrusive_list<(anonymous_namespace)::TestObject>::size
                           ((intrusive_list<(anonymous_namespace)::TestObject> *)&gtest_ar.message_)
      ;
      testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_long>
                ((EqHelper<false> *)local_c0,"1U","list.size()",&local_c4,&local_d0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
      if (!bVar1) {
        testing::Message::Message(&local_d8);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c0);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar__1.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-intrusive-list.cc"
                   ,0xe8,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,&local_d8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
        testing::Message::~Message(&local_d8);
      }
      gtest_ar_.message_.ptr_._5_3_ = 0;
      gtest_ar_.message_.ptr_._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
      if (gtest_ar_.message_.ptr_._4_4_ == 0) {
        bVar1 = wabt::intrusive_list<(anonymous_namespace)::TestObject>::empty
                          ((intrusive_list<(anonymous_namespace)::TestObject> *)&gtest_ar.message_);
        local_f1 = (bool)((bVar1 ^ 0xffU) & 1);
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_f0,&local_f1,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
        if (!bVar1) {
          testing::Message::Message(&local_100);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_128,(internal *)local_f0,(AssertionResult *)"list.empty()","true",
                     "false",pcVar3);
          pcVar3 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_108,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-intrusive-list.cc"
                     ,0xe9,pcVar3);
          testing::internal::AssertHelper::operator=(&local_108,&local_100);
          testing::internal::AssertHelper::~AssertHelper(&local_108);
          std::__cxx11::string::~string((string *)&local_128);
          testing::Message::~Message(&local_100);
        }
        gtest_ar_.message_.ptr_._5_3_ = 0;
        gtest_ar_.message_.ptr_._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
        if (gtest_ar_.message_.ptr_._4_4_ == 0) {
          gtest_ar_.message_.ptr_._4_4_ = 0;
        }
      }
    }
  }
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::~intrusive_list
            ((intrusive_list<(anonymous_namespace)::TestObject> *)&gtest_ar.message_);
  return;
}

Assistant:

TEST_F(IntrusiveListTest, size_empty) {
  TestObjectList list;
  ASSERT_EQ(0U, list.size());
  ASSERT_TRUE(list.empty());

  list.emplace_back(1);
  ASSERT_EQ(1U, list.size());
  ASSERT_FALSE(list.empty());
}